

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateDocCommentBodyForLocation
               (Printer *printer,SourceLocation *location)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  char *text;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string comments;
  string local_78;
  string local_50;
  
  bVar6 = (location->leading_comments)._M_string_length == 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (&location->leading_comments)[bVar6]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (&location->leading_comments)[bVar6]._M_string_length);
  if (local_50._M_string_length != 0) {
    EscapePhpdoc(&local_78,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    SplitStringUsing(&local_50,"\n",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
    while ((local_78._M_dataplus._M_p != (pointer)local_78._M_string_length &&
           (*(long *)(local_78._M_string_length + -0x18) == 0))) {
      pcVar2 = (pointer)(local_78._M_string_length + -0x20);
      pcVar1 = (pointer)(local_78._M_string_length + -0x20);
      pcVar3 = (pointer)(local_78._M_string_length + -0x10);
      local_78._M_string_length = (size_type)pcVar2;
      if (*(pointer *)pcVar1 != pcVar3) {
        operator_delete(*(pointer *)pcVar1,*(long *)pcVar3 + 1);
      }
    }
    io::Printer::Print(printer," * <pre>\n");
    if ((pointer)local_78._M_string_length != local_78._M_dataplus._M_p) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        text = " *^line^\n";
        if ((*(long *)(local_78._M_dataplus._M_p + lVar4 + 8) != 0) &&
           (text = " * ^line^\n",
           *(((string *)(local_78._M_dataplus._M_p + lVar4))->_M_dataplus)._M_p != '/')) {
          text = " *^line^\n";
        }
        io::Printer::Print(printer,text,"line",(string *)(local_78._M_dataplus._M_p + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < (ulong)((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p)
                              >> 5));
    }
    io::Printer::Print(printer," * </pre>\n *\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void GenerateDocCommentBodyForLocation(
    io::Printer* printer, const SourceLocation& location) {
  string comments = location.leading_comments.empty() ?
      location.trailing_comments : location.leading_comments;
  if (!comments.empty()) {
    // TODO(teboring):  Ideally we should parse the comment text as Markdown and
    //   write it back as HTML, but this requires a Markdown parser.  For now
    //   we just use <pre> to get fixed-width text formatting.

    // If the comment itself contains block comment start or end markers,
    // HTML-escape them so that they don't accidentally close the doc comment.
    comments = EscapePhpdoc(comments);

    vector<string> lines = Split(comments, "\n");
    while (!lines.empty() && lines.back().empty()) {
      lines.pop_back();
    }

    printer->Print(" * <pre>\n");
    for (int i = 0; i < lines.size(); i++) {
      // Most lines should start with a space.  Watch out for lines that start
      // with a /, since putting that right after the leading asterisk will
      // close the comment.
      if (!lines[i].empty() && lines[i][0] == '/') {
        printer->Print(" * ^line^\n", "line", lines[i]);
      } else {
        printer->Print(" *^line^\n", "line", lines[i]);
      }
    }
    printer->Print(
        " * </pre>\n"
        " *\n");
  }
}